

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void exchangeObjects(object *array1,object *array2,int size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  object *poVar4;
  object *poVar5;
  bool bVar6;
  
  walk(memoryPointer,memoryTop,array1,array2,size);
  walk(staticPointer,staticTop,array1,array2,size);
  lVar1 = (long)rootTop;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if (0 < size) {
        uVar3 = 0;
        do {
          poVar4 = (object *)(&array2[1].header)[uVar3];
          if (((object *)(&array1[1].header)[uVar3] == rootStack[lVar2]) ||
             (bVar6 = poVar4 == rootStack[lVar2], poVar4 = (object *)(&array1[1].header)[uVar3],
             bVar6)) {
            rootStack[lVar2] = poVar4;
            break;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)size != uVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != lVar1);
  }
  lVar1 = (long)staticRootTop;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if (0 < size) {
        poVar4 = *staticRoots[lVar2];
        uVar3 = 0;
        do {
          poVar5 = (object *)(&array2[1].header)[uVar3];
          if (((object *)(&array1[1].header)[uVar3] == poVar4) ||
             (bVar6 = poVar5 == poVar4, poVar5 = (object *)(&array1[1].header)[uVar3], bVar6)) {
            *staticRoots[lVar2] = poVar5;
            break;
          }
          uVar3 = uVar3 + 1;
        } while ((uint)size != uVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != lVar1);
  }
  return;
}

Assistant:

void exchangeObjects(struct object *array1, struct object *array2, int size)
{
    int x;

    /*
     * Convert our memory spaces
     */
    walk(memoryPointer, memoryTop, array1, array2, size);
    walk(staticPointer, staticTop, array1, array2, size);

    /*
     * Fix up the root pointers, too
     */
    for (x = 0; x < rootTop; x++) {
        map(&rootStack[x], array1, array2, size);
    }
    for (x = 0; x < staticRootTop; x++) {
        map(staticRoots[x], array1, array2, size);
    }
}